

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::visit_null(basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             *this,semantic_tag param_1,ser_context *param_2,error_code *param_3)

{
  size_t *psVar1;
  container_type *pcVar2;
  pointer peVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  
  peVar3 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar3) {
    if (peVar3[-1].type_ == array) {
      begin_scalar_value(this);
      peVar3 = (this->stack_).
               super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((peVar3[-1].line_splits_ != multi_line) &&
       ((this->options_).line_length_limit_ <= this->column_)) {
      peVar3[-1].new_line_after_ = true;
      new_line(this);
    }
  }
  bVar4 = null_constant();
  null_constant();
  pcVar2 = (this->sink_).buf_ptr;
  std::__cxx11::string::replace
            ((ulong)pcVar2,pcVar2->_M_string_length,(char *)0x0,(ulong)bVar4._M_str);
  bVar4 = null_constant();
  this->column_ = this->column_ + bVar4._M_len;
  peVar3 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar3) {
    psVar1 = &peVar3[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }

            sink_.append(null_constant().data(), null_constant().size());
            column_ += null_constant().size();

            end_value();
            JSONCONS_VISITOR_RETURN;
        }